

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

from_chars_result __thiscall
semver::detail::range_parser::parse_range_comparator<int,int,int>
          (range_parser *this,
          vector<semver::detail::range_comparator<int,_int,_int>,_std::allocator<semver::detail::range_comparator<int,_int,_int>_>_>
          *out)

{
  bool bVar1;
  range_operator *prVar2;
  size_t k;
  char *ptr;
  from_chars_result fVar3;
  version_parser local_b0;
  version_parser parser;
  version<int,_int,_int> ver;
  token token;
  range_operator op;
  vector<semver::detail::range_comparator<int,_int,_int>,_std::allocator<semver::detail::range_comparator<int,_int,_int>_>_>
  *out_local;
  range_parser *this_local;
  from_chars_result res;
  
  token.lexeme._7_1_ = equal;
  detail::token::token
            ((token *)&ver.prerelease_identifiers.
                       super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = token_stream::advanceIfMatch
                    (&this->stream,
                     (token *)&ver.prerelease_identifiers.
                               super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,range_operator);
  if (bVar1) {
    prVar2 = std::
             get<semver::detail::range_operator,_std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                       ((variant<std::monostate,_unsigned_char,_char,_semver::detail::range_operator>
                         *)((long)&ver.prerelease_identifiers.
                                   super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
    token.lexeme._7_1_ = *prVar2;
  }
  skip_whitespaces(this);
  version<int,_int,_int>::version((version<int,_int,_int> *)&parser);
  version_parser::version_parser(&local_b0,&this->stream);
  fVar3 = version_parser::parse<int,int,int>(&local_b0,(version<int,_int,_int> *)&parser);
  this_local = (range_parser *)fVar3.super_from_chars_result.ptr;
  res.super_from_chars_result.ptr._0_4_ = fVar3.super_from_chars_result.ec;
  bVar1 = from_chars_result::operator_cast_to_bool((from_chars_result *)&this_local);
  if (bVar1) {
    std::
    vector<semver::detail::range_comparator<int,int,int>,std::allocator<semver::detail::range_comparator<int,int,int>>>
    ::emplace_back<semver::version<int,int,int>&,semver::detail::range_operator&>
              ((vector<semver::detail::range_comparator<int,int,int>,std::allocator<semver::detail::range_comparator<int,int,int>>>
                *)out,(version<int,_int,_int> *)&parser,(range_operator *)((long)&token.lexeme + 7))
    ;
    token_stream::peek((token *)this,(token_stream *)0x0,k);
    fVar3 = success(ptr);
    this_local = (range_parser *)fVar3.super_from_chars_result.ptr;
    res.super_from_chars_result.ptr._0_4_ = fVar3.super_from_chars_result.ec;
  }
  version<int,_int,_int>::~version((version<int,_int,_int> *)&parser);
  fVar3.super_from_chars_result.ec = (errc)res.super_from_chars_result.ptr;
  fVar3.super_from_chars_result.ptr = (char *)this_local;
  fVar3.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar3.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse_range_comparator(std::vector<detail::range_comparator<I1, I2, I3>>& out) noexcept {
      range_operator op = range_operator::equal;
      token token;
      if (stream.advanceIfMatch(token, token_type::range_operator)) {
        op = std::get<range_operator>(token.value);
      }

      skip_whitespaces();

      version<I1, I2, I3> ver;
      version_parser parser{ stream };
      if (const auto res = parser.parse(ver); !res) {
        return res;
      }

      out.emplace_back(ver, op);
      return success(stream.peek().lexeme);
    }